

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O3

Locale * icu_63::Locale::getLocale(int locid)

{
  Locale *pLVar1;
  long lVar2;
  
  pLVar1 = getLocaleCache();
  lVar2 = (long)locid;
  if (pLVar1 == (Locale *)0x0) {
    lVar2 = 0;
  }
  return pLVar1 + lVar2;
}

Assistant:

const Locale &
Locale::getLocale(int locid)
{
    Locale *localeCache = getLocaleCache();
    U_ASSERT((locid < eMAX_LOCALES)&&(locid>=0));
    if (localeCache == NULL) {
        // Failure allocating the locale cache.
        //   The best we can do is return a NULL reference.
        locid = 0;
    }
    return localeCache[locid]; /*operating on NULL*/
}